

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

void __thiscall wabt::Stream::MoveData(Stream *this,size_t dst_offset,size_t src_offset,size_t size)

{
  bool bVar1;
  Enum EVar2;
  size_t size_local;
  size_t src_offset_local;
  size_t dst_offset_local;
  Stream *this_local;
  
  bVar1 = Failed((Result)(this->result_).enum_);
  if (!bVar1) {
    if (this->log_stream_ != (Stream *)0x0) {
      Writef(this->log_stream_,"; move data: [%zx, %zx) -> [%zx, %zx)\n",src_offset,
             src_offset + size,dst_offset,dst_offset + size);
    }
    EVar2 = (*this->_vptr_Stream[3])(this,dst_offset,src_offset,size);
    (this->result_).enum_ = EVar2;
  }
  return;
}

Assistant:

void Stream::MoveData(size_t dst_offset, size_t src_offset, size_t size) {
  if (Failed(result_)) {
    return;
  }
  if (log_stream_) {
    log_stream_->Writef(
        "; move data: [%" PRIzx ", %" PRIzx ") -> [%" PRIzx ", %" PRIzx ")\n",
        src_offset, src_offset + size, dst_offset, dst_offset + size);
  }
  result_ = MoveDataImpl(dst_offset, src_offset, size);
}